

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O1

void simpleMinimal(word *x,word *pAux,word *minimal,permInfo *pi,int nVars)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  word *pIn;
  
  Kit_TruthCopy_64bit(pAux,x,nVars);
  Kit_TruthNot_64bit(x,nVars);
  iVar2 = memCompare(x,pAux,nVars);
  pIn = pAux;
  if (iVar2 == -1) {
    pIn = x;
  }
  Kit_TruthCopy_64bit(minimal,pIn,nVars);
  if (0 < (long)pi->totalSwaps) {
    lVar3 = (long)pi->totalSwaps + 1;
    do {
      Kit_TruthSwapAdjacentVars_64bit(x,nVars,pi->swapArray[lVar3 + -2]);
      Kit_TruthSwapAdjacentVars_64bit(pAux,nVars,pi->swapArray[lVar3 + -2]);
      iVar2 = memCompare(x,pAux,nVars);
      if (iVar2 < 1) {
        iVar2 = memCompare(x,minimal,nVars);
        if (iVar2 < 0) {
          Kit_TruthCopy_64bit(minimal,x,nVars);
          goto LAB_005da948;
        }
      }
      else {
LAB_005da948:
        iVar2 = memCompare(pAux,minimal,nVars);
        if (iVar2 < 1) {
          Kit_TruthCopy_64bit(minimal,pAux,nVars);
        }
      }
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)pi->totalFlips;
  if (0 < (long)pi->totalFlips) {
    do {
      Kit_TruthSwapAdjacentVars_64bit(x,nVars,0);
      Kit_TruthSwapAdjacentVars_64bit(pAux,nVars,0);
      Kit_TruthChangePhase_64bit(x,nVars,pi->flipArray[lVar3 + -1]);
      Kit_TruthChangePhase_64bit(pAux,nVars,pi->flipArray[lVar3 + -1]);
      iVar2 = memCompare(x,pAux,nVars);
      if (iVar2 < 1) {
        iVar2 = memCompare(x,minimal,nVars);
        if (iVar2 < 0) {
          Kit_TruthCopy_64bit(minimal,x,nVars);
          goto LAB_005da9ed;
        }
      }
      else {
LAB_005da9ed:
        iVar2 = memCompare(pAux,minimal,nVars);
        if (iVar2 < 1) {
          Kit_TruthCopy_64bit(minimal,pAux,nVars);
        }
      }
      if (0 < (long)pi->totalSwaps) {
        lVar4 = (long)pi->totalSwaps + 1;
        do {
          Kit_TruthSwapAdjacentVars_64bit(x,nVars,pi->swapArray[lVar4 + -2]);
          Kit_TruthSwapAdjacentVars_64bit(pAux,nVars,pi->swapArray[lVar4 + -2]);
          iVar2 = memCompare(x,pAux,nVars);
          if (iVar2 < 1) {
            iVar2 = memCompare(x,minimal,nVars);
            if (iVar2 < 0) {
              Kit_TruthCopy_64bit(minimal,x,nVars);
              goto LAB_005daa6b;
            }
          }
          else {
LAB_005daa6b:
            iVar2 = memCompare(pAux,minimal,nVars);
            if (iVar2 < 1) {
              Kit_TruthCopy_64bit(minimal,pAux,nVars);
            }
          }
          lVar4 = lVar4 + -1;
        } while (1 < lVar4);
      }
      bVar1 = 1 < lVar3;
      lVar3 = lVar3 + -1;
    } while (bVar1);
  }
  Kit_TruthCopy_64bit(x,minimal,nVars);
  return;
}

Assistant:

void simpleMinimal(word* x, word* pAux,word* minimal, permInfo* pi, int nVars)
{
    int i,j=0;
    Kit_TruthCopy_64bit( pAux, x, nVars );
    Kit_TruthNot_64bit( x, nVars );
    
    minWord(x, pAux, minimal, nVars);
    
    for(i=pi->totalSwaps-1;i>=0;i--)
    {
        Kit_TruthSwapAdjacentVars_64bit(x, nVars, pi->swapArray[i]);
        Kit_TruthSwapAdjacentVars_64bit(pAux, nVars, pi->swapArray[i]);
        minWord3(x, pAux, minimal, nVars);
    }
    for(j=pi->totalFlips-1;j>=0;j--)
    {
        Kit_TruthSwapAdjacentVars_64bit(x, nVars, 0);
        Kit_TruthSwapAdjacentVars_64bit(pAux, nVars, 0);
        Kit_TruthChangePhase_64bit(x, nVars, pi->flipArray[j]);
        Kit_TruthChangePhase_64bit(pAux, nVars, pi->flipArray[j]);
        minWord3(x, pAux, minimal, nVars);
        for(i=pi->totalSwaps-1;i>=0;i--)
        {
            Kit_TruthSwapAdjacentVars_64bit(x, nVars, pi->swapArray[i]);
            Kit_TruthSwapAdjacentVars_64bit(pAux, nVars, pi->swapArray[i]);
            minWord3(x, pAux, minimal, nVars);
        }
    } 
    Kit_TruthCopy_64bit( x, minimal, nVars );    
}